

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Operation<duckdb::string_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *state,string_t *x,hugeint_t *y,
               AggregateBinaryInput *binary)

{
  unsigned_long *puVar1;
  int64_t iVar2;
  AggregateBinaryInput *pAVar3;
  bool bVar4;
  string_t new_value;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    Execute<duckdb::string_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>>
              (state,(string_t)(x->value).pointer,*y,binary);
    return;
  }
  puVar1 = (binary->right_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  pAVar3 = binary;
  if ((puVar1 != (unsigned_long *)0x0) &&
     (pAVar3 = (AggregateBinaryInput *)binary->ridx,
     (puVar1[(ulong)pAVar3 >> 6] >> ((ulong)pAVar3 & 0x3f) & 1) == 0)) {
    return;
  }
  puVar1 = (binary->left_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    (state->super_ArgMinMaxStateBase).arg_null = false;
  }
  else {
    pAVar3 = (AggregateBinaryInput *)binary->lidx;
    bVar4 = (puVar1[(ulong)pAVar3 >> 6] >> ((ulong)pAVar3 & 0x3f) & 1) == 0;
    (state->super_ArgMinMaxStateBase).arg_null = bVar4;
    if (bVar4) goto LAB_0187a435;
  }
  new_value.value.pointer.ptr = (char *)pAVar3;
  new_value.value._0_8_ = (x->value).pointer.ptr;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)&state->arg,*(string_t **)&x->value,new_value);
LAB_0187a435:
  iVar2 = y->upper;
  (state->value).lower = y->lower;
  (state->value).upper = iVar2;
  (state->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}